

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexPlaneCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
cbtConvexPlaneCollisionAlgorithm::processCollision
          (cbtConvexPlaneCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  float fVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  cbtCollisionShape *pcVar15;
  cbtCollisionShape *pcVar16;
  cbtTransform *pcVar17;
  cbtPersistentManifold *this_00;
  cbtCollisionObject *pcVar18;
  cbtCollisionObject *pcVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  cbtCollisionObjectWrapper *pcVar26;
  undefined1 auVar27 [12];
  int iVar28;
  int iVar29;
  cbtCollisionObject *pcVar30;
  cbtDispatcherInfo *dispatchInfo_00;
  cbtCollisionObjectWrapper *pcVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  cbtScalar cVar46;
  float fVar47;
  float fVar48;
  cbtQuadWord cVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  cbtVector3 normalOnSurfaceB;
  float local_ec;
  float local_e8;
  float local_e4;
  undefined1 local_80 [8];
  cbtScalar cStack_78;
  uint local_70;
  float fStack_6c;
  uint local_68;
  uint local_60;
  float fStack_5c;
  uint local_58;
  float local_50;
  float local_4c;
  float local_48;
  undefined1 local_40 [16];
  undefined1 extraout_var [60];
  
  if (this->m_manifoldPtr != (cbtPersistentManifold *)0x0) {
    pcVar31 = body1Wrap;
    pcVar26 = body0Wrap;
    if (this->m_isSwapped != false) {
      pcVar31 = body0Wrap;
      pcVar26 = body1Wrap;
    }
    pcVar15 = pcVar26->m_shape;
    pcVar16 = pcVar31->m_shape;
    dispatchInfo_00 = (cbtDispatcherInfo *)resultOut;
    cbtTransform::inverse(pcVar26->m_worldTransform);
    auVar27 = stack0xffffffffffffff84;
    pcVar17 = pcVar31->m_worldTransform;
    fVar53 = (pcVar17->m_basis).m_el[1].m_floats[0];
    fVar47 = (pcVar17->m_basis).m_el[1].m_floats[1];
    fVar1 = (pcVar17->m_basis).m_el[1].m_floats[2];
    cVar2 = (pcVar17->m_basis).m_el[0].m_floats[2];
    cVar3 = (pcVar17->m_basis).m_el[0].m_floats[0];
    cVar4 = (pcVar17->m_basis).m_el[0].m_floats[1];
    cVar5 = (pcVar17->m_basis).m_el[2].m_floats[2];
    cVar6 = (pcVar17->m_basis).m_el[2].m_floats[0];
    cVar7 = (pcVar17->m_basis).m_el[2].m_floats[1];
    auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (float)local_80._4_4_)),ZEXT416((uint)cVar2),
                              ZEXT416((uint)local_80._0_4_));
    auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * (float)local_80._4_4_)),ZEXT416((uint)cVar3),
                              ZEXT416((uint)local_80._0_4_));
    auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar47 * (float)local_80._4_4_)),ZEXT416((uint)cVar4),
                              ZEXT416((uint)local_80._0_4_));
    auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)cVar5),ZEXT416((uint)cStack_78));
    auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)cVar6),ZEXT416((uint)cStack_78));
    auVar52 = vfmadd231ss_fma(auVar52,ZEXT416((uint)cVar7),ZEXT416((uint)cStack_78));
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * fStack_6c)),ZEXT416((uint)cVar3),
                              ZEXT416(local_70));
    auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)cVar6),ZEXT416(local_68));
    auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar47 * fStack_6c)),ZEXT416((uint)cVar4),
                              ZEXT416(local_70));
    auVar55 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fStack_6c)),ZEXT416((uint)cVar2),
                              ZEXT416(local_70));
    auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)cVar7),ZEXT416(local_68));
    auVar55 = vfmadd231ss_fma(auVar55,ZEXT416((uint)cVar5),ZEXT416(local_68));
    auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fStack_5c * fVar53)),ZEXT416(local_60),
                              ZEXT416((uint)cVar3));
    auVar50 = vfmadd231ss_fma(auVar50,ZEXT416(local_58),ZEXT416((uint)cVar6));
    auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar47 * fStack_5c)),ZEXT416(local_60),
                              ZEXT416((uint)cVar4));
    auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fStack_5c)),ZEXT416((uint)cVar2),
                              ZEXT416(local_60));
    auVar54 = vfmadd231ss_fma(auVar54,ZEXT416(local_58),ZEXT416((uint)cVar7));
    auVar56 = vfmadd231ss_fma(auVar56,ZEXT416((uint)cVar5),ZEXT416(local_58));
    _local_80 = auVar27;
    cbtTransform::inverse(pcVar17);
    pcVar17 = pcVar26->m_worldTransform;
    fVar53 = (pcVar17->m_basis).m_el[1].m_floats[2];
    cVar2 = (pcVar17->m_basis).m_el[0].m_floats[2];
    cVar3 = (pcVar17->m_basis).m_el[2].m_floats[2];
    cVar4 = (pcVar17->m_basis).m_el[1].m_floats[1];
    cVar5 = (pcVar17->m_basis).m_el[0].m_floats[1];
    cVar6 = (pcVar17->m_basis).m_el[2].m_floats[1];
    fVar47 = (pcVar17->m_basis).m_el[1].m_floats[0];
    cVar7 = (pcVar17->m_basis).m_el[0].m_floats[0];
    cVar46 = (pcVar17->m_basis).m_el[2].m_floats[0];
    auVar32 = vmulss_avx512f(ZEXT416((uint)fVar53),ZEXT416((uint)fStack_6c));
    auVar33 = vmulss_avx512f(ZEXT416((uint)cVar4),ZEXT416((uint)fStack_6c));
    auVar34 = vmulss_avx512f(ZEXT416((uint)local_80._4_4_),ZEXT416((uint)cVar4));
    auVar35 = vfmadd231ss_avx512f(auVar32,ZEXT416((uint)cVar2),ZEXT416(local_70));
    auVar36 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)cVar5),ZEXT416(local_70));
    auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar47 * (float)local_80._4_4_)),ZEXT416((uint)cVar7),
                              ZEXT416((uint)local_80._0_4_));
    auVar37 = vfmadd231ss_avx512f(ZEXT416((uint)(fStack_6c * fVar47)),ZEXT416((uint)cVar7),
                                  ZEXT416(local_70));
    auVar33 = vfmadd231ss_fma(auVar34,ZEXT416((uint)cVar5),ZEXT416((uint)local_80._0_4_));
    auVar38 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar53 * (float)local_80._4_4_)),
                                  ZEXT416((uint)cVar2),ZEXT416((uint)local_80._0_4_));
    auVar39 = vfmadd231ss_avx512f(auVar35,ZEXT416((uint)cVar3),ZEXT416(local_68));
    auVar40 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)cVar6),ZEXT416(local_68));
    auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)cVar46),ZEXT416((uint)cStack_78));
    auVar34 = vfmadd231ss_fma(auVar37,ZEXT416((uint)cVar46),ZEXT416(local_68));
    auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)cVar6),ZEXT416((uint)cStack_78));
    auVar35 = vfmadd231ss_fma(auVar38,ZEXT416((uint)cVar3),ZEXT416((uint)cStack_78));
    auVar36 = vmulss_avx512f(ZEXT416((uint)fVar47),ZEXT416((uint)fStack_5c));
    auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416(local_60),ZEXT416((uint)cVar7));
    auVar37 = vmulss_avx512f(ZEXT416((uint)cVar4),ZEXT416((uint)fStack_5c));
    auVar37 = vfmadd231ss_avx512f(auVar37,ZEXT416(local_60),ZEXT416((uint)cVar5));
    fVar47 = (pcVar17->m_origin).m_floats[1];
    auVar41 = vfmadd231ss_avx512f(auVar36,ZEXT416(local_58),ZEXT416((uint)cVar46));
    auVar36 = vfmadd231ss_fma(auVar37,ZEXT416(local_58),ZEXT416((uint)cVar6));
    auVar37 = vmulss_avx512f(ZEXT416((uint)fVar53),ZEXT416((uint)fStack_5c));
    auVar42 = vmulss_avx512f(ZEXT416((uint)fStack_5c),ZEXT416((uint)fVar47));
    auVar37 = vfmadd231ss_avx512f(auVar37,ZEXT416(local_60),ZEXT416((uint)cVar2));
    auVar37 = vfmadd231ss_fma(auVar37,ZEXT416(local_58),ZEXT416((uint)cVar3));
    cVar2 = (pcVar17->m_origin).m_floats[0];
    auVar38 = vfmadd231ss_fma(ZEXT416((uint)((float)local_80._4_4_ * fVar47)),ZEXT416((uint)cVar2),
                              ZEXT416((uint)local_80._0_4_));
    cVar3 = (pcVar17->m_origin).m_floats[2];
    auVar43 = vfmadd231ss_avx512f(ZEXT416((uint)(fStack_6c * fVar47)),ZEXT416((uint)cVar2),
                                  ZEXT416(local_70));
    auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)cVar2),ZEXT416(local_60));
    auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)cVar3),ZEXT416(local_58));
    auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)cVar3),ZEXT416((uint)cStack_78));
    auVar43 = vfmadd231ss_fma(auVar43,ZEXT416((uint)cVar3),ZEXT416(local_68));
    fVar53 = *(float *)((long)&pcVar16[2]._vptr_cbtCollisionShape + 4);
    uVar8 = pcVar16[2].m_shapeType;
    uVar9 = *(uint *)&pcVar16[2]._vptr_cbtCollisionShape;
    auVar45 = vfnmsub231ss_fma(ZEXT416((uint)(fVar53 * auVar52._0_4_)),ZEXT416(uVar9),
                               ZEXT416(auVar45._0_4_));
    auVar52 = vfnmsub231ss_fma(ZEXT416((uint)(fVar53 * auVar25._0_4_)),ZEXT416(uVar9),
                               ZEXT416(auVar24._0_4_));
    auVar24 = vfnmsub231ss_fma(ZEXT416((uint)(fVar53 * auVar54._0_4_)),ZEXT416(uVar9),
                               ZEXT416(auVar50._0_4_));
    auVar44 = vfnmadd231ss_fma(auVar45,ZEXT416(uVar8),ZEXT416(auVar44._0_4_));
    auVar45 = vfnmadd231ss_fma(auVar52,ZEXT416(uVar8),ZEXT416(auVar55._0_4_));
    auVar52 = vfnmadd231ss_fma(auVar24,ZEXT416(uVar8),ZEXT416(auVar56._0_4_));
    auVar44 = vinsertps_avx(auVar44,auVar45,0x10);
    cVar49.m_floats = (cbtScalar  [4])vinsertps_avx(auVar44,auVar52,0x28);
    _local_80 = cVar49.m_floats;
    (*pcVar15->_vptr_cbtCollisionShape[0x10])(pcVar15,local_80);
    auVar44 = vmovshdup_avx((undefined1  [16])cVar49.m_floats);
    fVar53 = auVar44._0_4_;
    pcVar17 = pcVar31->m_worldTransform;
    auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * auVar33._0_4_)),
                              (undefined1  [16])cVar49.m_floats,ZEXT416(auVar32._0_4_));
    auVar44 = vfmadd231ss_fma(auVar44,auVar52,ZEXT416(auVar35._0_4_));
    fVar20 = auVar44._0_4_ + auVar38._0_4_ + local_50;
    auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * auVar40._0_4_)),
                              (undefined1  [16])cVar49.m_floats,ZEXT416(auVar34._0_4_));
    auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * auVar36._0_4_)),
                              (undefined1  [16])cVar49.m_floats,ZEXT416(auVar41._0_4_));
    fVar53 = *(float *)((long)&pcVar16[2]._vptr_cbtCollisionShape + 4);
    auVar44 = vfmadd231ss_fma(auVar44,auVar52,ZEXT416(auVar39._0_4_));
    auVar45 = vfmadd231ss_fma(auVar45,auVar52,ZEXT416(auVar37._0_4_));
    fVar21 = auVar44._0_4_ + auVar43._0_4_ + local_4c;
    fVar22 = auVar45._0_4_ + auVar42._0_4_ + local_48;
    fVar47 = *(float *)&pcVar16[2]._vptr_cbtCollisionShape;
    fVar1 = (float)pcVar16[2].m_shapeType;
    auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * fVar21)),ZEXT416((uint)fVar47),
                              ZEXT416((uint)fVar20));
    auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)fVar1),ZEXT416((uint)fVar22));
    fVar23 = auVar44._0_4_ - *(float *)&pcVar16[2].m_userPointer;
    cVar2 = (pcVar17->m_basis).m_el[0].m_floats[0];
    fVar10 = (pcVar17->m_basis).m_el[0].m_floats[1];
    cVar3 = (pcVar17->m_basis).m_el[0].m_floats[2];
    cVar4 = (pcVar17->m_basis).m_el[1].m_floats[0];
    fVar48 = (pcVar17->m_basis).m_el[1].m_floats[1];
    cVar5 = (pcVar17->m_basis).m_el[1].m_floats[2];
    cVar6 = (pcVar17->m_basis).m_el[2].m_floats[0];
    fVar11 = (pcVar17->m_basis).m_el[2].m_floats[1];
    cVar7 = (pcVar17->m_basis).m_el[2].m_floats[2];
    fVar12 = (pcVar17->m_origin).m_floats[0];
    fVar13 = (pcVar17->m_origin).m_floats[1];
    fVar14 = (pcVar17->m_origin).m_floats[2];
    cVar46 = cbtPersistentManifold::getContactBreakingThreshold(this->m_manifoldPtr);
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    if (fVar23 < cVar46 + resultOut->m_closestPointDistanceThreshold) {
      pcVar17 = pcVar31->m_worldTransform;
      fVar22 = fVar22 - fVar23 * fVar1;
      fVar20 = fVar20 - fVar23 * fVar47;
      fVar21 = fVar21 - fVar23 * fVar53;
      auVar44 = vfmadd213ss_fma(ZEXT416((uint)cVar6),ZEXT416((uint)fVar20),
                                ZEXT416((uint)(fVar21 * fVar11)));
      auVar45 = vfmadd213ss_fma(ZEXT416((uint)cVar7),ZEXT416((uint)fVar22),auVar44);
      auVar44 = vfmadd213ss_fma(ZEXT416((uint)cVar2),ZEXT416((uint)fVar20),
                                ZEXT416((uint)(fVar21 * fVar10)));
      auVar44 = vfmadd213ss_fma(ZEXT416((uint)cVar3),ZEXT416((uint)fVar22),auVar44);
      auVar52 = vfmadd213ss_fma(ZEXT416((uint)cVar4),ZEXT416((uint)fVar20),
                                ZEXT416((uint)(fVar21 * fVar48)));
      fVar53 = *(float *)((long)&pcVar16[2]._vptr_cbtCollisionShape + 4);
      auVar52 = vfmadd213ss_fma(ZEXT416((uint)cVar5),ZEXT416((uint)fVar22),auVar52);
      uVar8 = *(uint *)&pcVar16[2]._vptr_cbtCollisionShape;
      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * (pcVar17->m_basis).m_el[1].m_floats[1])),
                                ZEXT416(uVar8),ZEXT416((uint)(pcVar17->m_basis).m_el[1].m_floats[0])
                               );
      auVar44 = vinsertps_avx(ZEXT416((uint)(auVar44._0_4_ + fVar12)),
                              ZEXT416((uint)(auVar52._0_4_ + fVar13)),0x10);
      uVar9 = pcVar16[2].m_shapeType;
      local_40 = vinsertps_avx(auVar44,ZEXT416((uint)(auVar45._0_4_ + fVar14)),0x28);
      auVar44 = vfmadd231ss_fma(auVar24,ZEXT416(uVar9),
                                ZEXT416((uint)(pcVar17->m_basis).m_el[1].m_floats[2]));
      auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * (pcVar17->m_basis).m_el[0].m_floats[1])),
                                ZEXT416(uVar8),ZEXT416((uint)(pcVar17->m_basis).m_el[0].m_floats[0])
                               );
      auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * (pcVar17->m_basis).m_el[2].m_floats[1])),
                                ZEXT416(uVar8),ZEXT416((uint)(pcVar17->m_basis).m_el[2].m_floats[0])
                               );
      auVar45 = vfmadd231ss_fma(auVar45,ZEXT416(uVar9),
                                ZEXT416((uint)(pcVar17->m_basis).m_el[0].m_floats[2]));
      auVar52 = vfmadd231ss_fma(auVar52,ZEXT416(uVar9),
                                ZEXT416((uint)(pcVar17->m_basis).m_el[2].m_floats[2]));
      auVar44 = vinsertps_avx(auVar45,auVar44,0x10);
      _local_80 = (cbtScalar  [4])vinsertps_avx(auVar44,auVar52,0x28);
      (*(resultOut->super_Result)._vptr_Result[4])((ulong)(uint)fVar23,resultOut);
    }
    if ((pcVar15->m_shapeType < 7) &&
       (resultOut->m_manifoldPtr->m_cachedPoints < this->m_minimumPointsPerturbationThreshold)) {
      fVar53 = (float)pcVar16[2].m_shapeType;
      auVar44._8_4_ = 0x7fffffff;
      auVar44._0_8_ = 0x7fffffff7fffffff;
      auVar44._12_4_ = 0x7fffffff;
      auVar44 = vandps_avx512vl(ZEXT416((uint)fVar53),auVar44);
      if (auVar44._0_4_ <= 0.70710677) {
        fVar53 = *(float *)((long)&pcVar16[2]._vptr_cbtCollisionShape + 4);
        local_e4 = *(float *)&pcVar16[2]._vptr_cbtCollisionShape;
        auVar45._8_4_ = 0x80000000;
        auVar45._0_8_ = 0x8000000080000000;
        auVar45._12_4_ = 0x80000000;
        auVar45 = vxorps_avx512vl(ZEXT416((uint)fVar53),auVar45);
        auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * fVar53)),ZEXT416((uint)local_e4),
                                  ZEXT416((uint)local_e4));
        auVar44 = vsqrtss_avx(auVar44,auVar44);
        local_ec = 1.0 / auVar44._0_4_;
        local_e4 = local_e4 * local_ec;
        local_ec = local_ec * auVar45._0_4_;
        local_e8 = 0.0;
      }
      else {
        local_e8 = *(float *)((long)&pcVar16[2]._vptr_cbtCollisionShape + 4);
        auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * fVar53)),ZEXT416((uint)local_e8),
                                  ZEXT416((uint)local_e8));
        auVar44 = vsqrtss_avx(auVar44,auVar44);
        auVar52._8_4_ = 0x80000000;
        auVar52._0_8_ = 0x8000000080000000;
        auVar52._12_4_ = 0x80000000;
        auVar45 = vxorps_avx512vl(ZEXT416((uint)fVar53),auVar52);
        fVar53 = 1.0 / auVar44._0_4_;
        local_e4 = fVar53 * auVar45._0_4_;
        local_e8 = local_e8 * fVar53;
        local_ec = 0.0;
      }
      fVar53 = 0.0;
      (*pcVar15->_vptr_cbtCollisionShape[4])(pcVar15);
      auVar44 = vminss_avx(SUB6416(ZEXT464(0x3ec90fdb),0),
                           ZEXT416((uint)(gContactBreakingThreshold / fVar53)));
      fVar53 = auVar44._0_4_ * 0.5;
      fVar47 = sinf(fVar53);
      fVar53 = cosf(fVar53);
      iVar28 = this->m_numPerturbationIterations;
      if (0 < iVar28) {
        iVar29 = 0;
        auVar44 = vfmadd231ss_fma(ZEXT416((uint)(local_e4 * local_e4)),ZEXT416((uint)local_ec),
                                  ZEXT416((uint)local_ec));
        auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)local_e8),ZEXT416((uint)local_e8));
        auVar44 = vsqrtss_avx(auVar44,auVar44);
        fVar47 = fVar47 / auVar44._0_4_;
        local_ec = local_ec * fVar47;
        local_e4 = local_e4 * fVar47;
        local_e8 = local_e8 * fVar47;
        do {
          fVar47 = *(float *)((long)&pcVar16[2]._vptr_cbtCollisionShape + 4);
          auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar47 * fVar47)),
                                    ZEXT416(*(uint *)&pcVar16[2]._vptr_cbtCollisionShape),
                                    ZEXT416(*(uint *)&pcVar16[2]._vptr_cbtCollisionShape));
          auVar44 = vfmadd213ss_fma(ZEXT416((uint)pcVar16[2].m_shapeType),
                                    ZEXT416((uint)pcVar16[2].m_shapeType),auVar44);
          auVar44 = vsqrtss_avx(auVar44,auVar44);
          fVar47 = (6.2831855 / (float)iVar28) * (float)iVar29 * 0.5;
          fVar48 = sinf(fVar47);
          fVar48 = fVar48 / auVar44._0_4_;
          fVar1 = fVar48 * *(float *)&pcVar16[2]._vptr_cbtCollisionShape;
          fVar10 = fVar48 * *(float *)((long)&pcVar16[2]._vptr_cbtCollisionShape + 4);
          fVar48 = fVar48 * (float)pcVar16[2].m_shapeType;
          auVar51._0_4_ = cosf(fVar47);
          auVar51._4_60_ = extraout_var;
          auVar50 = auVar51._0_16_;
          auVar44 = vfmsub231ss_fma(ZEXT416((uint)(fVar48 * fVar53)),auVar50,ZEXT416((uint)local_e8)
                                   );
          auVar45 = vfmsub231ss_fma(ZEXT416((uint)(fVar10 * fVar53)),auVar50,ZEXT416((uint)local_e4)
                                   );
          auVar52 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * fVar53)),auVar50,ZEXT416((uint)local_ec))
          ;
          auVar56 = ZEXT416((uint)fVar1);
          auVar44 = vfnmadd231ss_fma(auVar44,auVar56,ZEXT416((uint)local_e4));
          auVar54 = ZEXT416((uint)fVar48);
          auVar24 = vfnmadd231ss_fma(auVar45,auVar54,ZEXT416((uint)local_ec));
          auVar55 = ZEXT416((uint)fVar10);
          auVar52 = vfnmadd231ss_fma(auVar52,auVar55,ZEXT416((uint)local_e8));
          auVar45 = vfmadd231ss_fma(auVar44,auVar55,ZEXT416((uint)local_ec));
          auVar52 = vfmadd231ss_fma(auVar52,auVar54,ZEXT416((uint)local_e4));
          auVar24 = vfmadd231ss_fma(auVar24,auVar56,ZEXT416((uint)local_e8));
          auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * local_ec)),auVar50,ZEXT416((uint)fVar53))
          ;
          auVar44 = vfmadd231ss_fma(auVar44,auVar55,ZEXT416((uint)local_e4));
          auVar25 = vfmadd231ss_fma(auVar44,auVar54,ZEXT416((uint)local_e8));
          auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * auVar52._0_4_)),auVar25,auVar56);
          auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * auVar24._0_4_)),auVar25,auVar55);
          auVar44 = vfmadd231ss_fma(auVar44,auVar24,auVar54);
          auVar55 = vfmadd231ss_fma(auVar55,auVar45,auVar56);
          auVar56 = ZEXT416((uint)fVar10);
          auVar44 = vfnmadd231ss_fma(auVar44,auVar45,auVar56);
          auVar54 = ZEXT416((uint)fVar48);
          auVar55 = vfnmadd231ss_fma(auVar55,auVar52,auVar54);
          auVar44 = vinsertps_avx(auVar44,auVar55,0x10);
          auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * auVar45._0_4_)),auVar25,auVar54);
          auVar55 = vfmadd231ss_fma(auVar55,auVar52,auVar56);
          auVar52 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * auVar52._0_4_)),auVar50,auVar25);
          auVar25 = vfnmadd231ss_fma(auVar55,auVar24,ZEXT416((uint)fVar1));
          auVar52 = vfnmadd231ss_fma(auVar52,auVar56,auVar24);
          auVar45 = vfnmadd231ss_fma(auVar52,auVar54,auVar45);
          auVar45 = vinsertps_avx(auVar25,auVar45,0x10);
          _local_80 = (cbtScalar  [4])vmovlhps_avx(auVar44,auVar45);
          collideSingleContact
                    (this,(cbtQuaternion *)local_80,body0Wrap,body1Wrap,dispatchInfo_00,resultOut);
          iVar28 = this->m_numPerturbationIterations;
          iVar29 = iVar29 + 1;
        } while (iVar29 < iVar28);
      }
    }
    if (((this->m_ownManifold == true) && (this->m_manifoldPtr->m_cachedPoints != 0)) &&
       (this_00 = resultOut->m_manifoldPtr, this_00->m_cachedPoints != 0)) {
      pcVar18 = resultOut->m_body0Wrap->m_collisionObject;
      pcVar19 = resultOut->m_body1Wrap->m_collisionObject;
      pcVar30 = pcVar19;
      if (this_00->m_body0 == pcVar18) {
        pcVar30 = pcVar18;
        pcVar18 = pcVar19;
      }
      cbtPersistentManifold::refreshContactPoints
                (this_00,&pcVar30->m_worldTransform,&pcVar18->m_worldTransform);
    }
  }
  return;
}

Assistant:

void cbtConvexPlaneCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	(void)dispatchInfo;
	if (!m_manifoldPtr)
		return;

	const cbtCollisionObjectWrapper* convexObjWrap = m_isSwapped ? body1Wrap : body0Wrap;
	const cbtCollisionObjectWrapper* planeObjWrap = m_isSwapped ? body0Wrap : body1Wrap;

	cbtConvexShape* convexShape = (cbtConvexShape*)convexObjWrap->getCollisionShape();
	cbtStaticPlaneShape* planeShape = (cbtStaticPlaneShape*)planeObjWrap->getCollisionShape();

	bool hasCollision = false;
	const cbtVector3& planeNormal = planeShape->getPlaneNormal();
	const cbtScalar& planeConstant = planeShape->getPlaneConstant();
	cbtTransform planeInConvex;
	planeInConvex = convexObjWrap->getWorldTransform().inverse() * planeObjWrap->getWorldTransform();
	cbtTransform convexInPlaneTrans;
	convexInPlaneTrans = planeObjWrap->getWorldTransform().inverse() * convexObjWrap->getWorldTransform();

	cbtVector3 vtx = convexShape->localGetSupportingVertex(planeInConvex.getBasis() * -planeNormal);
	cbtVector3 vtxInPlane = convexInPlaneTrans(vtx);
	cbtScalar distance = (planeNormal.dot(vtxInPlane) - planeConstant);

	cbtVector3 vtxInPlaneProjected = vtxInPlane - distance * planeNormal;
	cbtVector3 vtxInPlaneWorld = planeObjWrap->getWorldTransform() * vtxInPlaneProjected;

	hasCollision = distance < m_manifoldPtr->getContactBreakingThreshold()+ resultOut->m_closestPointDistanceThreshold;
	resultOut->setPersistentManifold(m_manifoldPtr);
	if (hasCollision)
	{
		/// report a contact. internally this will be kept persistent, and contact reduction is done
		cbtVector3 normalOnSurfaceB = planeObjWrap->getWorldTransform().getBasis() * planeNormal;
		cbtVector3 pOnB = vtxInPlaneWorld;
		resultOut->addContactPoint(normalOnSurfaceB, pOnB, distance);
	}

	//the perturbation algorithm doesn't work well with implicit surfaces such as spheres, cylinder and cones:
	//they keep on rolling forever because of the additional off-center contact points
	//so only enable the feature for polyhedral shapes (cbtBoxShape, cbtConvexHullShape etc)
	if (convexShape->isPolyhedral() && resultOut->getPersistentManifold()->getNumContacts() < m_minimumPointsPerturbationThreshold)
	{
		cbtVector3 v0, v1;
		cbtPlaneSpace1(planeNormal, v0, v1);
		//now perform 'm_numPerturbationIterations' collision queries with the perturbated collision objects

		const cbtScalar angleLimit = 0.125f * SIMD_PI;
		cbtScalar perturbeAngle;
		cbtScalar radius = convexShape->getAngularMotionDisc();
		perturbeAngle = gContactBreakingThreshold / radius;
		if (perturbeAngle > angleLimit)
			perturbeAngle = angleLimit;

		cbtQuaternion perturbeRot(v0, perturbeAngle);
		for (int i = 0; i < m_numPerturbationIterations; i++)
		{
			cbtScalar iterationAngle = i * (SIMD_2_PI / cbtScalar(m_numPerturbationIterations));
			cbtQuaternion rotq(planeNormal, iterationAngle);
			collideSingleContact(rotq.inverse() * perturbeRot * rotq, body0Wrap, body1Wrap, dispatchInfo, resultOut);
		}
	}

	if (m_ownManifold)
	{
		if (m_manifoldPtr->getNumContacts())
		{
			resultOut->refreshContactPoints();
		}
	}
}